

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Structure * fts5IndexOptimizeStruct(Fts5Index *p,Fts5Structure *pStruct)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *puVar4;
  long lVar5;
  Fts5StructureSegment *pFVar6;
  int local_54;
  int local_50;
  int iSegOut;
  int iSeg;
  int iLvl;
  Fts5StructureLevel *pLvl;
  int local_38;
  int nThis;
  int i;
  int nSeg;
  sqlite3_int64 nByte;
  Fts5Structure *pNew;
  Fts5Structure *pStruct_local;
  Fts5Index *p_local;
  
  iVar1 = pStruct->nSegment;
  if (iVar1 < 2) {
    p_local = (Fts5Index *)0x0;
  }
  else {
    for (local_38 = 0; local_38 < pStruct->nLevel; local_38 = local_38 + 1) {
      iVar2 = pStruct->aLevel[local_38].nSeg;
      if ((iVar2 == iVar1) || ((iVar2 == iVar1 + -1 && (pStruct->aLevel[local_38].nMerge == iVar2)))
         ) {
        fts5StructureRef(pStruct);
        return pStruct;
      }
    }
    nByte = (sqlite3_int64)sqlite3Fts5MallocZero(&p->rc,(long)(pStruct->nLevel + 1) * 0x10 + 0x28);
    if ((undefined4 *)nByte != (undefined4 *)0x0) {
      *(int *)(nByte + 0x14) = pStruct->nLevel + 1;
      *(undefined4 *)nByte = 1;
      *(u64 *)(nByte + 8) = pStruct->nWriteCounter;
      lVar5 = (long)pStruct->nLevel;
      pvVar3 = sqlite3Fts5MallocZero(&p->rc,(long)iVar1 * 0xc);
      *(void **)(nByte + (lVar5 * 4 + 8) * 4) = pvVar3;
      if (*(long *)(nByte + (lVar5 * 4 + 8) * 4) == 0) {
        sqlite3_free((void *)nByte);
        nByte = 0;
      }
      else {
        local_54 = 0;
        iSegOut = pStruct->nLevel;
        while (iSegOut = iSegOut + -1, -1 < iSegOut) {
          for (local_50 = 0; local_50 < pStruct->aLevel[iSegOut].nSeg; local_50 = local_50 + 1) {
            puVar4 = (undefined8 *)(*(long *)(nByte + (lVar5 * 4 + 8) * 4) + (long)local_54 * 0xc);
            pFVar6 = pStruct->aLevel[iSegOut].aSeg + local_50;
            *puVar4 = *(undefined8 *)pFVar6;
            *(int *)(puVar4 + 1) = pFVar6->pgnoLast;
            local_54 = local_54 + 1;
          }
        }
        *(int *)(nByte + (lVar5 * 4 + 7) * 4) = iVar1;
        *(int *)(nByte + 0x10) = iVar1;
      }
    }
    p_local = (Fts5Index *)nByte;
  }
  return (Fts5Structure *)p_local;
}

Assistant:

static Fts5Structure *fts5IndexOptimizeStruct(
  Fts5Index *p, 
  Fts5Structure *pStruct
){
  Fts5Structure *pNew = 0;
  sqlite3_int64 nByte = sizeof(Fts5Structure);
  int nSeg = pStruct->nSegment;
  int i;

  /* Figure out if this structure requires optimization. A structure does
  ** not require optimization if either:
  **
  **  + it consists of fewer than two segments, or 
  **  + all segments are on the same level, or
  **  + all segments except one are currently inputs to a merge operation.
  **
  ** In the first case, return NULL. In the second, increment the ref-count
  ** on *pStruct and return a copy of the pointer to it.
  */
  if( nSeg<2 ) return 0;
  for(i=0; i<pStruct->nLevel; i++){
    int nThis = pStruct->aLevel[i].nSeg;
    if( nThis==nSeg || (nThis==nSeg-1 && pStruct->aLevel[i].nMerge==nThis) ){
      fts5StructureRef(pStruct);
      return pStruct;
    }
    assert( pStruct->aLevel[i].nMerge<=nThis );
  }

  nByte += (pStruct->nLevel+1) * sizeof(Fts5StructureLevel);
  pNew = (Fts5Structure*)sqlite3Fts5MallocZero(&p->rc, nByte);

  if( pNew ){
    Fts5StructureLevel *pLvl;
    nByte = nSeg * sizeof(Fts5StructureSegment);
    pNew->nLevel = pStruct->nLevel+1;
    pNew->nRef = 1;
    pNew->nWriteCounter = pStruct->nWriteCounter;
    pLvl = &pNew->aLevel[pStruct->nLevel];
    pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(&p->rc, nByte);
    if( pLvl->aSeg ){
      int iLvl, iSeg;
      int iSegOut = 0;
      /* Iterate through all segments, from oldest to newest. Add them to
      ** the new Fts5Level object so that pLvl->aSeg[0] is the oldest
      ** segment in the data structure.  */
      for(iLvl=pStruct->nLevel-1; iLvl>=0; iLvl--){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          pLvl->aSeg[iSegOut] = pStruct->aLevel[iLvl].aSeg[iSeg];
          iSegOut++;
        }
      }
      pNew->nSegment = pLvl->nSeg = nSeg;
    }else{
      sqlite3_free(pNew);
      pNew = 0;
    }
  }

  return pNew;
}